

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

size_t http_write_cb(char *ptr,size_t size,size_t nmemb,void *user_data)

{
  char *__n;
  size_t curl_writen_size;
  size_t remain_size;
  size_t nc;
  http_body *param;
  void *user_data_local;
  size_t nmemb_local;
  size_t size_local;
  char *ptr_local;
  
  if (user_data == (void *)0x0) {
    ptr_local = (char *)0x0;
  }
  else if (*user_data == 0) {
    ptr_local = (char *)(*(long *)((long)user_data + 0x10) - *(long *)((long)user_data + 0x18));
    if (ptr_local == (char *)0x0) {
      ptr_local = (char *)0x0;
    }
    else {
      __n = (char *)(size * nmemb);
      if (__n < ptr_local) {
        memcpy((void *)(*(long *)((long)user_data + 8) + *(long *)((long)user_data + 0x18)),ptr,
               (size_t)__n);
        *(char **)((long)user_data + 0x18) = __n + *(long *)((long)user_data + 0x18);
        ptr_local = __n;
      }
      else {
        memcpy((void *)(*(long *)((long)user_data + 8) + *(long *)((long)user_data + 0x18)),ptr,
               (size_t)ptr_local);
        *(char **)((long)user_data + 0x18) = ptr_local + *(long *)((long)user_data + 0x18);
      }
    }
  }
  else {
    ptr_local = (char *)fwrite(ptr,size,nmemb,*user_data);
    *(char **)((long)user_data + 0x18) = ptr_local + *(long *)((long)user_data + 0x18);
  }
  return (size_t)ptr_local;
}

Assistant:

size_t http_write_cb(char *ptr, size_t size, size_t nmemb, void *user_data) {
    struct http_body *param = (struct http_body *)user_data;
    if (!param) {
        return 0;
    }
    if(param->f != NULL){
        size_t nc = fwrite(ptr, size, nmemb, param->f);
        param->pos_n += nc;
        return nc;
    }
    size_t remain_size = param->buffer_size - param->pos_n;
    if(remain_size <= 0){ 
        return 0;//buffer 已经写满。
    }
    size_t curl_writen_size = size*nmemb;
    if(curl_writen_size < remain_size){ //要写的数据还在 buffer 的范围内。
        memcpy(param->buffer+param->pos_n, ptr, curl_writen_size);
        param->pos_n += curl_writen_size;
        return curl_writen_size;
    }else{//要写的数据超出了 buffer 的范围，把 buffer 写满即可。
        memcpy(param->buffer+param->pos_n, ptr, remain_size);
        param->pos_n += remain_size;
        return remain_size;
    }
}